

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall slang::parsing::Lexer::isNextTokenOnSameLine(Lexer *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Lexer *in_RDI;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_parsing_Lexer_cpp:260:29)>
  guard;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffac;
  anon_class_16_2_552147e0_for_func local_38;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_parsing_Lexer_cpp:260:29)>
  local_28;
  byte local_1;
  
  local_38.currBuff = in_RDI->sourceBuffer;
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/parsing/Lexer.cpp:260:29)>
  ::ScopeGuard(&local_28,&local_38);
  while( true ) {
    cVar1 = peek(in_RDI);
    in_stack_ffffffffffffffac = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffac);
    iVar3 = (int)cVar1;
    if (cVar1 == '\0') break;
    if (iVar3 == 9) {
LAB_0067e964:
      advance(in_RDI);
    }
    else {
      if (iVar3 == 10) break;
      if (iVar3 - 0xbU < 2) goto LAB_0067e964;
      if (iVar3 == 0xd) break;
      if (iVar3 == 0x20) goto LAB_0067e964;
      if (iVar3 != 0x2f) {
        local_1 = 1;
        goto LAB_0067ea9e;
      }
      cVar1 = peek(in_RDI,1);
      in_stack_ffffffffffffffa4 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffa4);
      in_stack_ffffffffffffffa0 = (int)cVar1;
      if (in_stack_ffffffffffffffa0 != 0x2a) {
        if (in_stack_ffffffffffffffa0 == 0x2f) {
          local_1 = 0;
        }
        else {
          local_1 = 1;
        }
        goto LAB_0067ea9e;
      }
      advance(in_RDI,2);
      while ((bVar2 = consume((Lexer *)CONCAT44(in_stack_ffffffffffffffac,iVar3),
                              (char)((uint)in_stack_ffffffffffffffa4 >> 0x18)), !bVar2 ||
             (bVar2 = consume((Lexer *)CONCAT44(in_stack_ffffffffffffffac,iVar3),
                              (char)((uint)in_stack_ffffffffffffffa4 >> 0x18)), !bVar2))) {
        cVar1 = peek(in_RDI);
        if ((cVar1 == '\0') && (bVar2 = reallyAtEnd(in_RDI), bVar2)) {
          local_1 = 0;
          goto LAB_0067ea9e;
        }
        advance(in_RDI);
      }
    }
  }
  local_1 = 0;
LAB_0067ea9e:
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/parsing/Lexer.cpp:260:29)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_parsing_Lexer_cpp:260:29)>
                 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return (bool)(local_1 & 1);
}

Assistant:

bool Lexer::isNextTokenOnSameLine() {
    auto guard = ScopeGuard([this, currBuff = sourceBuffer] { sourceBuffer = currBuff; });

    while (true) {
        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                break;
            case '/':
                switch (peek(1)) {
                    case '/':
                        return false;
                    case '*':
                        advance(2);
                        while (true) {
                            if (consume('*') && consume('/'))
                                break;
                            if (peek() == '\0' && reallyAtEnd())
                                return false;
                            advance();
                        }
                        break;
                    default:
                        return true;
                }
                break;
            case '\0':
            case '\r':
            case '\n':
                return false;
            default:
                return true;
        }
    }
}